

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_internal_entry.h
# Opt level: O2

int __thiscall ParallelManager::init(ParallelManager *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  int iVar2;
  
  std::mutex::lock(&this->m_lock);
  if (this->m_init_done == false) {
    uVar1 = std::function<unsigned_int_()>::operator()((function<unsigned_int_()> *)ctx);
    this->m_task_count = uVar1;
    this->m_init_done = true;
  }
  iVar2 = pthread_mutex_unlock((pthread_mutex_t *)this);
  return iVar2;
}

Assistant:

void init(std::function<unsigned int(void)> init_func)
	{
		std::lock_guard<std::mutex> lck(m_lock);
		if (!m_init_done)
		{
			m_task_count = init_func();
			m_init_done = true;
		}
	}